

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall IntrusiveListTest_pop_back_Test::TestBody(IntrusiveListTest_pop_back_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  vector<int,_std::allocator<int>_> local_120;
  allocator<int> local_105;
  int local_104;
  iterator local_100;
  size_type local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  allocator<int> local_d1;
  int local_d0 [2];
  iterator local_c8;
  size_type local_c0;
  vector<int,_std::allocator<int>_> local_b8;
  allocator<int> local_9d;
  int local_9c [3];
  iterator local_90;
  size_type local_88;
  vector<int,_std::allocator<int>_> local_80;
  allocator<int> local_61;
  int local_60 [4];
  iterator local_50;
  size_type local_48;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_pop_back_Test *this_local;
  
  local_60[0] = 1;
  local_60[1] = 2;
  local_60[2] = 3;
  local_60[3] = 4;
  local_50 = local_60;
  local_48 = 4;
  list.size_ = (size_t)this;
  std::allocator<int>::allocator(&local_61);
  __l_02._M_len = local_48;
  __l_02._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_02,&local_61);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator(&local_61);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_9c[0] = 1;
  local_9c[1] = 2;
  local_9c[2] = 3;
  local_90 = local_9c;
  local_88 = 3;
  std::allocator<int>::allocator(&local_9d);
  __l_01._M_len = local_88;
  __l_01._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_01,&local_9d);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_80);
  std::vector<int,_std::allocator<int>_>::~vector(&local_80);
  std::allocator<int>::~allocator(&local_9d);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_d0[0] = 1;
  local_d0[1] = 2;
  local_c8 = local_d0;
  local_c0 = 2;
  std::allocator<int>::allocator(&local_d1);
  __l_00._M_len = local_c0;
  __l_00._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8,__l_00,&local_d1);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b8);
  std::allocator<int>::~allocator(&local_d1);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_104 = 1;
  local_100 = &local_104;
  local_f8 = 1;
  std::allocator<int>::allocator(&local_105);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l,&local_105);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_f0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_f0);
  std::allocator<int>::~allocator(&local_105);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  memset(&local_120,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_120);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_120);
  std::vector<int,_std::allocator<int>_>::~vector(&local_120);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, pop_back) {
  TestObjectList list = NewList({1, 2, 3, 4});

  list.pop_back();
  AssertListEq(list, {1, 2, 3});
  list.pop_back();
  AssertListEq(list, {1, 2});
  list.pop_back();
  AssertListEq(list, {1});
  list.pop_back();
  AssertListEq(list, {});
}